

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

Pubkey * __thiscall
cfd::core::Privkey::GeneratePubkey(Pubkey *__return_storage_ptr__,Privkey *this,bool is_compressed)

{
  _Alloc_hider priv_key;
  value_type_conflict *__val;
  size_t priv_key_len;
  CfdException *pCVar1;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed_pubkey;
  int local_dc;
  string local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  undefined1 local_98 [8];
  pointer puStack_90;
  pointer local_88;
  ByteData local_80;
  ByteData local_68;
  ByteData local_50;
  CfdSourceLocation local_38;
  
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x21);
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x21;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,&this->data_
                    );
  priv_key._M_p = local_d8._M_dataplus._M_p;
  priv_key_len = ByteData::GetDataSize(&this->data_);
  local_dc = wally_ec_public_key_from_private_key
                       ((uchar *)priv_key._M_p,priv_key_len,
                        local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  if ((uchar *)local_d8._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_d8._M_dataplus._M_p,
                    local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
  }
  if (local_dc != 0) {
    local_98 = (undefined1  [8])0x6e4bdb;
    puStack_90 = (pointer)CONCAT44(puStack_90._4_4_,0x332);
    local_88 = "GeneratePubkey";
    ByteData::GetHex_abi_cxx11_(&local_d8,&this->data_);
    logger::log<int&,std::__cxx11::string&>
              ((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
               "wally_ec_public_key_from_private_key error. ret={} privkey={}.",&local_dc,&local_d8)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Generate Pubkey error.","");
    CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,&local_d8);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (is_compressed) {
    ByteData::ByteData(&local_50,&local_b8);
    Pubkey::Pubkey(__return_storage_ptr__,&local_50);
  }
  else {
    local_98 = (undefined1  [8])0x0;
    puStack_90 = (pointer)0x0;
    local_88 = (pointer)0x0;
    local_98 = (undefined1  [8])operator_new(0x41);
    puStack_90 = (pointer)((long)local_98 + 0x41);
    *(uchar *)((long)local_98 + 0x30) = '\0';
    *(uchar *)((long)local_98 + 0x31) = '\0';
    *(uchar *)((long)local_98 + 0x32) = '\0';
    *(uchar *)((long)local_98 + 0x33) = '\0';
    *(uchar *)((long)local_98 + 0x34) = '\0';
    *(uchar *)((long)local_98 + 0x35) = '\0';
    *(uchar *)((long)local_98 + 0x36) = '\0';
    *(uchar *)((long)local_98 + 0x37) = '\0';
    *(uchar *)((long)local_98 + 0x38) = '\0';
    *(uchar *)((long)local_98 + 0x39) = '\0';
    *(uchar *)((long)local_98 + 0x3a) = '\0';
    *(uchar *)((long)local_98 + 0x3b) = '\0';
    *(uchar *)((long)local_98 + 0x3c) = '\0';
    *(uchar *)((long)local_98 + 0x3d) = '\0';
    *(uchar *)((long)local_98 + 0x3e) = '\0';
    *(uchar *)((long)local_98 + 0x3f) = '\0';
    *(uchar *)((long)local_98 + 0x20) = '\0';
    *(uchar *)((long)local_98 + 0x21) = '\0';
    *(uchar *)((long)local_98 + 0x22) = '\0';
    *(uchar *)((long)local_98 + 0x23) = '\0';
    *(uchar *)((long)local_98 + 0x24) = '\0';
    *(uchar *)((long)local_98 + 0x25) = '\0';
    *(uchar *)((long)local_98 + 0x26) = '\0';
    *(uchar *)((long)local_98 + 0x27) = '\0';
    *(uchar *)((long)local_98 + 0x28) = '\0';
    *(uchar *)((long)local_98 + 0x29) = '\0';
    *(uchar *)((long)local_98 + 0x2a) = '\0';
    *(uchar *)((long)local_98 + 0x2b) = '\0';
    *(uchar *)((long)local_98 + 0x2c) = '\0';
    *(uchar *)((long)local_98 + 0x2d) = '\0';
    *(uchar *)((long)local_98 + 0x2e) = '\0';
    *(uchar *)((long)local_98 + 0x2f) = '\0';
    *(uchar *)((long)local_98 + 0x10) = '\0';
    *(uchar *)((long)local_98 + 0x11) = '\0';
    *(uchar *)((long)local_98 + 0x12) = '\0';
    *(uchar *)((long)local_98 + 0x13) = '\0';
    *(uchar *)((long)local_98 + 0x14) = '\0';
    *(uchar *)((long)local_98 + 0x15) = '\0';
    *(uchar *)((long)local_98 + 0x16) = '\0';
    *(uchar *)((long)local_98 + 0x17) = '\0';
    *(uchar *)((long)local_98 + 0x18) = '\0';
    *(uchar *)((long)local_98 + 0x19) = '\0';
    *(uchar *)((long)local_98 + 0x1a) = '\0';
    *(uchar *)((long)local_98 + 0x1b) = '\0';
    *(uchar *)((long)local_98 + 0x1c) = '\0';
    *(uchar *)((long)local_98 + 0x1d) = '\0';
    *(uchar *)((long)local_98 + 0x1e) = '\0';
    *(uchar *)((long)local_98 + 0x1f) = '\0';
    *(uchar *)((long)local_98 + 0) = '\0';
    *(uchar *)((long)local_98 + 1) = '\0';
    *(uchar *)((long)local_98 + 2) = '\0';
    *(uchar *)((long)local_98 + 3) = '\0';
    *(uchar *)((long)local_98 + 4) = '\0';
    *(uchar *)((long)local_98 + 5) = '\0';
    *(uchar *)((long)local_98 + 6) = '\0';
    *(uchar *)((long)local_98 + 7) = '\0';
    *(uchar *)((long)local_98 + 8) = '\0';
    *(uchar *)((long)local_98 + 9) = '\0';
    *(uchar *)((long)local_98 + 10) = '\0';
    *(uchar *)((long)local_98 + 0xb) = '\0';
    *(uchar *)((long)local_98 + 0xc) = '\0';
    *(uchar *)((long)local_98 + 0xd) = '\0';
    *(uchar *)((long)local_98 + 0xe) = '\0';
    *(uchar *)((long)local_98 + 0xf) = '\0';
    *(uchar *)((long)local_98 + 0x40) = '\0';
    local_88 = puStack_90;
    local_dc = wally_ec_public_key_decompress
                         (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(uchar *)local_98,0x41);
    if (local_dc != 0) {
      local_38.filename = "cfdcore_key.cpp";
      local_38.line = 0x342;
      local_38.funcname = "GeneratePubkey";
      ByteData::ByteData(&local_68,&local_b8);
      ByteData::GetHex_abi_cxx11_(&local_d8,&local_68);
      logger::log<int&,std::__cxx11::string&>
                (&local_38,kCfdLogLevelWarning,
                 "wally_ec_public_key_decompress error. ret={} compressed pubkey={}.",&local_dc,
                 &local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Decompressed Pubkey error.","");
      CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,&local_d8);
      __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData(&local_80,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
    Pubkey::Pubkey(__return_storage_ptr__,&local_80);
    local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_98;
    local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_88;
    if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_98;
      local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_88;
    }
  }
  if (local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Pubkey Privkey::GeneratePubkey(bool is_compressed) const {
  std::vector<uint8_t> pubkey(Pubkey::kCompressedPubkeySize);
  int ret = wally_ec_public_key_from_private_key(
      data_.GetBytes().data(), data_.GetDataSize(), pubkey.data(),
      pubkey.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_ec_public_key_from_private_key error. ret={} privkey={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Generate Pubkey error.");
  }
  if (is_compressed) {
    return Pubkey(pubkey);
  }

  std::vector<uint8_t> uncompressed_pubkey(Pubkey::kPubkeySize);
  ret = wally_ec_public_key_decompress(
      pubkey.data(), pubkey.size(), uncompressed_pubkey.data(),
      uncompressed_pubkey.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE,
        "wally_ec_public_key_decompress error. ret={} compressed pubkey={}.",
        ret, ByteData(pubkey).GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Decompressed Pubkey error.");
  }
  return Pubkey(uncompressed_pubkey);
}